

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O0

int lws_create_client_ws_object(lws_client_connect_info *i,lws *wsi)

{
  _lws_websocket_related *p_Var1;
  uint8_t local_24;
  int v;
  lws *wsi_local;
  lws_client_connect_info *i_local;
  
  local_24 = '\r';
  p_Var1 = (_lws_websocket_related *)lws_zalloc(0xc0,"client ws struct");
  wsi->ws = p_Var1;
  if (wsi->ws == (_lws_websocket_related *)0x0) {
    _lws_log(4,"OOM\n");
    i_local._4_4_ = 1;
  }
  else {
    if ((i->ietf_version_or_minus_one != -1) && (i->ietf_version_or_minus_one != 0)) {
      local_24 = (uint8_t)i->ietf_version_or_minus_one;
    }
    wsi->ws->ietf_spec_revision = local_24;
    i_local._4_4_ = 0;
  }
  return i_local._4_4_;
}

Assistant:

int
lws_create_client_ws_object(const struct lws_client_connect_info *i,
			    struct lws *wsi)
{
	int v = SPEC_LATEST_SUPPORTED;

	/* allocate the ws struct for the wsi */
	wsi->ws = lws_zalloc(sizeof(*wsi->ws), "client ws struct");
	if (!wsi->ws) {
		lwsl_notice("OOM\n");
		return 1;
	}

	/* -1 means just use latest supported */
	if (i->ietf_version_or_minus_one != -1 &&
	    i->ietf_version_or_minus_one)
		v = i->ietf_version_or_minus_one;

	wsi->ws->ietf_spec_revision = v;

	return 0;
}